

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O1

void __thiscall TestClass::handlePeriodic(TestClass *this)

{
  undefined1 auVar1 [16];
  timeval curTime;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  auVar1 = SEXT816(local_20.tv_usec - (this->mLastTime).tv_usec) * SEXT816(0x20c49ba5e353f7cf);
  this->mPeriodElapsed =
       this->mPeriodElapsed +
       ((int)local_20.tv_sec - (int)(this->mLastTime).tv_sec) * 1000 +
       ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f));
  this->mPeriodCount = this->mPeriodCount + 1;
  (this->mLastTime).tv_sec = CONCAT44(local_20.tv_sec._4_4_,(int)local_20.tv_sec);
  (this->mLastTime).tv_usec = local_20.tv_usec;
  return;
}

Assistant:

void TestClass::handlePeriodic()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &mLastTime );
	mPeriodElapsed += elapsed;
	mPeriodCount++;
	LOG_NOTICE( "Periodic elapsed is %d, total periodic is %d, total elapsed is %d\n",
				elapsed, mPeriodCount, mPeriodElapsed );
	mLastTime = curTime;
}